

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

char * init_stack_segement(void)

{
  char *pcVar1;
  undefined4 *puVar2;
  
  pcVar1 = (char *)calloc(1,0xffff);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0xf1;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

char* init_stack_segement() {
	char *ptr{ nullptr };
	ptr = (char *)malloc(stack_length);
	if (ptr != nullptr) {
		memset(ptr, 0, stack_length);//内存清空
		return ptr;
	}
	else throw(LVM_STACK_SEGEMENT_ERROR);
}